

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

time_t gettime(void)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  timeval ts;
  
  iVar1 = gettimeofday((timeval *)&ts,(__timezone_ptr_t)0x0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    log_write(3,"<3>init: gettimeofday failed: %s\n",pcVar3);
    ts.tv_sec = 0;
  }
  return ts.tv_sec;
}

Assistant:

static time_t gettime(void)
{
    struct timeval ts;
    int ret;

    ret = gettimeofday(&ts, NULL);
    if (ret < 0) {
        ERROR("gettimeofday failed: %s\n", strerror(errno));
        return 0;
    }

    return ts.tv_sec;
}